

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_sharded.hpp
# Opt level: O0

shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>
__thiscall
ylt::util::
map_sharded_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::value_type>_>_>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::my_hash<137UL>_>
::find(map_sharded_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type>_>_>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<137UL>_>
       *this,key_type *key)

{
  element_type *in_RDI;
  shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>
  sVar1;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_stack_00000008;
  my_hash<137UL> *in_stack_00000010;
  map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type>_>_>_>
  *in_stack_00000018;
  map_sharded_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type>_>_>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<137UL>_>
  *in_stack_ffffffffffffffe0;
  
  ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::my_hash<137UL>::
  operator()(in_stack_00000010,in_stack_00000008);
  get_sharded(in_stack_ffffffffffffffe0,(size_t)in_RDI);
  sVar1 = internal::
          map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::value_type>_>_>_>
          ::find(in_stack_00000018,(key_type *)in_stack_00000010);
  sVar1.
  super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>
          )sVar1.
           super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<typename mapped_type::element_type> find(
      const key_type& key) const {
    return get_sharded(Hash{}(key)).find(key);
  }